

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O2

void Assimp::insertMorphTimeValue
               (vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_> *values,
               float time,float weight,uint value)

{
  pointer pMVar1;
  pointer pMVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  key k;
  MorphTimeValues val;
  
  pMVar1 = (values->
           super__Vector_base<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pMVar2 = (values->
           super__Vector_base<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)pMVar2 - (long)pMVar1;
  k.mWeight = weight;
  k.mValue = value;
  val.mTime = time;
  if ((lVar3 == 0) || (time < pMVar1->mTime)) {
    val.mKeys.
    super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    val.mKeys.
    super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    val.mKeys.
    super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>::
    push_back(&val.mKeys,&k);
    std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>::insert
              (values,(values->
                      super__Vector_base<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>
                      )._M_impl.super__Vector_impl_data._M_start,&val);
  }
  else {
    pMVar2 = pMVar2 + -1;
    if (time < pMVar2->mTime || time == pMVar2->mTime) {
      uVar4 = 1;
      while( true ) {
        uVar5 = (ulong)(uVar4 - 1);
        if ((ulong)(lVar3 >> 5) <= uVar5) {
          return;
        }
        if (ABS(time - pMVar1[uVar5].mTime) < 1e-06) {
          std::vector<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>::
          push_back(&pMVar1[uVar5].mKeys,&k);
          return;
        }
        if ((pMVar1[uVar5].mTime < time) && (time < pMVar1[uVar4].mTime)) break;
        uVar4 = uVar4 + 1;
      }
      val.mKeys.
      super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      val.mKeys.
      super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      val.mKeys.
      super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>::
      push_back(&val.mKeys,&k);
      std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>::insert
                (values,(values->
                        super__Vector_base<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>
                        )._M_impl.super__Vector_impl_data._M_start + uVar5,&val);
    }
    else {
      val.mKeys.
      super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      val.mKeys.
      super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      val.mKeys.
      super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>::
      push_back(&val.mKeys,&k);
      std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>::insert
                (values,(values->
                        super__Vector_base<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>
                        )._M_impl.super__Vector_impl_data._M_finish,&val);
    }
  }
  std::_Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>::
  ~_Vector_base(&val.mKeys.
                 super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>
               );
  return;
}

Assistant:

void insertMorphTimeValue(std::vector<MorphTimeValues> &values, float time, float weight, unsigned int value)
{
    MorphTimeValues::key k;
    k.mValue = value;
    k.mWeight = weight;
    if (values.size() == 0 || time < values[0].mTime)
    {
        MorphTimeValues val;
        val.mTime = time;
        val.mKeys.push_back(k);
        values.insert(values.begin(), val);
        return;
    }
    if (time > values.back().mTime)
    {
        MorphTimeValues val;
        val.mTime = time;
        val.mKeys.push_back(k);
        values.insert(values.end(), val);
        return;
    }
    for (unsigned int i = 0; i < values.size(); i++)
    {
        if (std::abs(time - values[i].mTime) < 1e-6f)
        {
            values[i].mKeys.push_back(k);
            return;
        }
        else if (time > values[i].mTime && time < values[i + 1].mTime)
        {
            MorphTimeValues val;
            val.mTime = time;
            val.mKeys.push_back(k);
            values.insert(values.begin() + i, val);
            return;
        }
    }
    // should not get here
}